

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_gtar_filename.c
# Opt level: O3

void test_read_format_gtar_filename(void)

{
  int iVar1;
  wchar_t wVar2;
  char *pcVar3;
  archive *paVar4;
  int64_t iVar5;
  archive_entry *ae;
  archive_entry *local_38;
  
  extract_reference_file("test_read_format_gtar_filename_eucjp.tar.Z");
  pcVar3 = setlocale(6,"en_US.UTF-8");
  if (pcVar3 == (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                   ,L'(');
    test_skipping("en_US.UTF-8 locale not available on this system.");
  }
  else {
    paVar4 = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                     ,L',',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_read_support_filter_all(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'-',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar4
                       );
    iVar1 = archive_read_support_format_all(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'.',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar4
                       );
    wVar2 = archive_read_set_options(paVar4,"hdrcharset=eucJP");
    if (wVar2 == L'\0') {
      wVar2 = archive_read_open_filename(paVar4,"test_read_format_gtar_filename_eucjp.tar.Z",0x2800)
      ;
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'5',0,"ARCHIVE_OK",(long)wVar2,
                          "archive_read_open_filename(a, refname, 10240)",paVar4);
      iVar1 = archive_read_next_header(paVar4,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'8',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4
                         );
      pcVar3 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                 ,L':',anon_var_dwarf_77c24 + 0x36,"\"\\xe6\\xbc\\xa2\\xe5\\xad\\x97.txt\"",pcVar3,
                 "archive_entry_pathname(ae)",(void *)0x0,L'\0');
      iVar5 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L';',8,"8",iVar5,"archive_entry_size(ae)",(void *)0x0);
      iVar1 = archive_read_next_header(paVar4,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'>',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4
                         );
      pcVar3 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                 ,L'?',anon_var_dwarf_56264 + 0x10,"\"\\xe8\\xa1\\xa8.txt\"",pcVar3,
                 "archive_entry_pathname(ae)",(void *)0x0,L'\0');
      iVar5 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'@',4,"4",iVar5,"archive_entry_size(ae)",(void *)0x0);
      wVar2 = archive_entry_is_encrypted(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'A',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
      iVar1 = archive_read_has_encrypted_entries(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'B',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                          "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",paVar4);
      iVar1 = archive_read_next_header(paVar4,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'F',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar4);
      iVar1 = archive_filter_code(paVar4,0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'I',3,"ARCHIVE_FILTER_COMPRESS",(long)iVar1,"archive_filter_code(a, 0)",
                          paVar4);
      iVar1 = archive_format(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'J',0x30004,"ARCHIVE_FORMAT_TAR_GNUTAR",(long)iVar1,"archive_format(a)",
                          paVar4);
      iVar1 = archive_read_close(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'M',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
    }
    else {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                     ,L'0');
      test_skipping("This system cannot convert character-set from eucJP to UTF-8.");
    }
    iVar1 = archive_read_free(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'O',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  }
  pcVar3 = setlocale(6,"Japanese_Japan");
  if ((pcVar3 == (char *)0x0) && (pcVar3 = setlocale(6,"ja_JP.SJIS"), pcVar3 == (char *)0x0)) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                   ,L'ī');
    test_skipping("CP932 locale not available on this system.");
  }
  else {
    paVar4 = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                     ,L'į',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_read_support_filter_all(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'İ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                        paVar4);
    iVar1 = archive_read_support_format_all(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'ı',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                        paVar4);
    wVar2 = archive_read_set_options(paVar4,"hdrcharset=eucJP");
    if (wVar2 == L'\0') {
      wVar2 = archive_read_open_filename(paVar4,"test_read_format_gtar_filename_eucjp.tar.Z",0x2800)
      ;
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'ĸ',0,"ARCHIVE_OK",(long)wVar2,
                          "archive_read_open_filename(a, refname, 10240)",paVar4);
      iVar1 = archive_read_next_header(paVar4,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'Ļ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar4);
      pcVar3 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                 ,L'ļ',anon_var_dwarf_77d95 + 0x2a,"\"\\x8a\\xbf\\x8e\\x9a.txt\"",pcVar3,
                 "archive_entry_pathname(ae)",(void *)0x0,L'\0');
      iVar5 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'Ľ',8,"8",iVar5,"archive_entry_size(ae)",(void *)0x0);
      iVar1 = archive_read_next_header(paVar4,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'ŀ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar4);
      pcVar3 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                 ,L'Ł',anon_var_dwarf_9dba3 + 0xb,"\"\\x95\\x5c.txt\"",pcVar3,
                 "archive_entry_pathname(ae)",(void *)0x0,L'\0');
      iVar5 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'ł',4,"4",iVar5,"archive_entry_size(ae)",(void *)0x0);
      iVar1 = archive_read_next_header(paVar4,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'ņ',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar4);
      iVar1 = archive_filter_code(paVar4,0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'ŉ',3,"ARCHIVE_FILTER_COMPRESS",(long)iVar1,"archive_filter_code(a, 0)"
                          ,paVar4);
      iVar1 = archive_format(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'Ŋ',0x30004,"ARCHIVE_FORMAT_TAR_GNUTAR",(long)iVar1,"archive_format(a)"
                          ,paVar4);
      iVar1 = archive_read_close(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'ō',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
    }
    else {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                     ,L'ĳ');
      test_skipping("This system cannot convert character-set from eucJP.");
    }
    iVar1 = archive_read_free(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'ŏ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  }
  extract_reference_file("test_read_format_gtar_filename_cp866.tar.Z");
  pcVar3 = setlocale(6,"Russian_Russia.20866");
  if ((pcVar3 == (char *)0x0) && (pcVar3 = setlocale(6,"ru_RU.KOI8-R"), pcVar3 == (char *)0x0)) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                   ,L']');
    test_skipping("ru_RU.KOI8-R locale not available on this system.");
  }
  else {
    paVar4 = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                     ,L'a',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_read_support_filter_all(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'b',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar4
                       );
    iVar1 = archive_read_support_format_all(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'c',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar4
                       );
    wVar2 = archive_read_set_options(paVar4,"hdrcharset=CP866");
    if (wVar2 == L'\0') {
      wVar2 = archive_read_open_filename(paVar4,"test_read_format_gtar_filename_cp866.tar.Z",0x2800)
      ;
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'j',0,"ARCHIVE_OK",(long)wVar2,
                          "archive_read_open_filename(a, refname, 10240)",paVar4);
      iVar1 = archive_read_next_header(paVar4,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'm',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4
                         );
      pcVar3 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                 ,L'o',anon_var_dwarf_5a256,"\"\\xf0\\xf2\\xe9\\xf7\\xe5\\xf4\"",pcVar3,
                 "archive_entry_pathname(ae)",(void *)0x0,L'\0');
      iVar5 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'p',6,"6",iVar5,"archive_entry_size(ae)",(void *)0x0);
      iVar1 = archive_read_next_header(paVar4,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L's',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4
                         );
      pcVar3 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                 ,L'u',anon_var_dwarf_5a274,"\"\\xd0\\xd2\\xc9\\xd7\\xc5\\xd4\"",pcVar3,
                 "archive_entry_pathname(ae)",(void *)0x0,L'\0');
      iVar5 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'v',6,"6",iVar5,"archive_entry_size(ae)",(void *)0x0);
      iVar1 = archive_read_next_header(paVar4,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'z',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar4);
      iVar1 = archive_filter_code(paVar4,0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'}',3,"ARCHIVE_FILTER_COMPRESS",(long)iVar1,"archive_filter_code(a, 0)",
                          paVar4);
      iVar1 = archive_format(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'~',0x30004,"ARCHIVE_FORMAT_TAR_GNUTAR",(long)iVar1,"archive_format(a)",
                          paVar4);
      iVar1 = archive_read_close(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'\x81',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
    }
    else {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                     ,L'e');
      test_skipping("This system cannot convert character-set from CP866 to KOI8-R.");
    }
    iVar1 = archive_read_free(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'\x83',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  }
  pcVar3 = setlocale(6,"en_US.UTF-8");
  if (pcVar3 == (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                   ,L'\x90');
    test_skipping("en_US.UTF-8 locale not available on this system.");
  }
  else {
    paVar4 = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                     ,L'\x94',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_read_support_filter_all(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'\x95',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                        paVar4);
    iVar1 = archive_read_support_format_all(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'\x96',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                        paVar4);
    wVar2 = archive_read_set_options(paVar4,"hdrcharset=CP866");
    if (wVar2 == L'\0') {
      wVar2 = archive_read_open_filename(paVar4,"test_read_format_gtar_filename_cp866.tar.Z",0x2800)
      ;
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'\x9d',0,"ARCHIVE_OK",(long)wVar2,
                          "archive_read_open_filename(a, refname, 10240)",paVar4);
      iVar1 = archive_read_next_header(paVar4,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'\xa0',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar4);
      pcVar3 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                 ,L'¢',anon_var_dwarf_5a292,
                 "\"\\xd0\\x9f\\xd0\\xa0\\xd0\\x98\\xd0\\x92\\xd0\\x95\\xd0\\xa2\"",pcVar3,
                 "archive_entry_pathname(ae)",(void *)0x0,L'\0');
      iVar5 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'£',6,"6",iVar5,"archive_entry_size(ae)",(void *)0x0);
      iVar1 = archive_read_next_header(paVar4,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'¦',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar4);
      pcVar3 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                 ,L'¨',anon_var_dwarf_5a2b4,
                 "\"\\xd0\\xbf\\xd1\\x80\\xd0\\xb8\\xd0\\xb2\\xd0\\xb5\\xd1\\x82\"",pcVar3,
                 "archive_entry_pathname(ae)",(void *)0x0,L'\0');
      iVar5 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'©',6,"6",iVar5,"archive_entry_size(ae)",(void *)0x0);
      iVar1 = archive_read_next_header(paVar4,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'­',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar4);
      iVar1 = archive_filter_code(paVar4,0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'°',3,"ARCHIVE_FILTER_COMPRESS",(long)iVar1,"archive_filter_code(a, 0)"
                          ,paVar4);
      iVar1 = archive_format(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'±',0x30004,"ARCHIVE_FORMAT_TAR_GNUTAR",(long)iVar1,"archive_format(a)"
                          ,paVar4);
      iVar1 = archive_read_close(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'´',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
    }
    else {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                     ,L'\x98');
      test_skipping("This system cannot convert character-set from CP866 to UTF-8.");
    }
    iVar1 = archive_read_free(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'¶',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  }
  pcVar3 = setlocale(6,"Russian_Russia");
  if ((pcVar3 == (char *)0x0) && (pcVar3 = setlocale(6,"ru_RU.CP1251"), pcVar3 == (char *)0x0)) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                   ,L'ŝ');
    test_skipping("CP1251 locale not available on this system.");
  }
  else {
    paVar4 = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                     ,L'š',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_read_support_filter_all(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'Ţ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                        paVar4);
    iVar1 = archive_read_support_format_all(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'ţ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                        paVar4);
    wVar2 = archive_read_set_options(paVar4,"hdrcharset=CP866");
    if (wVar2 == L'\0') {
      wVar2 = archive_read_open_filename(paVar4,"test_read_format_gtar_filename_cp866.tar.Z",0x2800)
      ;
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'Ū',0,"ARCHIVE_OK",(long)wVar2,
                          "archive_read_open_filename(a, refname, 10240)",paVar4);
      iVar1 = archive_read_next_header(paVar4,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'ŭ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar4);
      pcVar3 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                 ,L'ů',anon_var_dwarf_5a2f6,"\"\\xcf\\xd0\\xc8\\xc2\\xc5\\xd2\"",pcVar3,
                 "archive_entry_pathname(ae)",(void *)0x0,L'\0');
      iVar5 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'Ű',6,"6",iVar5,"archive_entry_size(ae)",(void *)0x0);
      iVar1 = archive_read_next_header(paVar4,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'ų',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar4);
      pcVar3 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                 ,L'ŵ',anon_var_dwarf_5a30c,"\"\\xef\\xf0\\xe8\\xe2\\xe5\\xf2\"",pcVar3,
                 "archive_entry_pathname(ae)",(void *)0x0,L'\0');
      iVar5 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'Ŷ',6,"6",iVar5,"archive_entry_size(ae)",(void *)0x0);
      iVar1 = archive_read_next_header(paVar4,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'ź',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar4);
      iVar1 = archive_filter_code(paVar4,0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'Ž',3,"ARCHIVE_FILTER_COMPRESS",(long)iVar1,"archive_filter_code(a, 0)"
                          ,paVar4);
      iVar1 = archive_format(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'ž',0x30004,"ARCHIVE_FORMAT_TAR_GNUTAR",(long)iVar1,"archive_format(a)"
                          ,paVar4);
      iVar1 = archive_read_close(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'Ɓ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
    }
    else {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                     ,L'ť');
      test_skipping("This system cannot convert character-set from CP866 to CP1251.");
    }
    iVar1 = archive_read_free(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'ƃ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  }
  pcVar3 = setlocale(6,"Russian_Russia");
  if (pcVar3 == (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                   ,L'Ɩ');
    test_skipping("Russian_Russia locale not available on this system.");
  }
  else {
    paVar4 = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                     ,L'ƚ',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_read_support_filter_all(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'ƛ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                        paVar4);
    iVar1 = archive_read_support_format_all(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'Ɯ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                        paVar4);
    wVar2 = archive_read_open_filename(paVar4,"test_read_format_gtar_filename_cp866.tar.Z",0x2800);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'ƞ',0,"ARCHIVE_OK",(long)wVar2,
                        "archive_read_open_filename(a, refname, 10240)",paVar4);
    iVar1 = archive_read_next_header(paVar4,&local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'ơ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4)
    ;
    pcVar3 = archive_entry_pathname(local_38);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
               ,L'ƣ',anon_var_dwarf_5a2f6,"\"\\xcf\\xd0\\xc8\\xc2\\xc5\\xd2\"",pcVar3,
               "archive_entry_pathname(ae)",(void *)0x0,L'\0');
    iVar5 = archive_entry_size(local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'Ƥ',6,"6",iVar5,"archive_entry_size(ae)",(void *)0x0);
    iVar1 = archive_read_next_header(paVar4,&local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'Ƨ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4)
    ;
    pcVar3 = archive_entry_pathname(local_38);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
               ,L'Ʃ',anon_var_dwarf_5a30c,"\"\\xef\\xf0\\xe8\\xe2\\xe5\\xf2\"",pcVar3,
               "archive_entry_pathname(ae)",(void *)0x0,L'\0');
    iVar5 = archive_entry_size(local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'ƪ',6,"6",iVar5,"archive_entry_size(ae)",(void *)0x0);
    iVar1 = archive_read_next_header(paVar4,&local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'Ʈ',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4
                       );
    iVar1 = archive_filter_code(paVar4,0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'Ʊ',3,"ARCHIVE_FILTER_COMPRESS",(long)iVar1,"archive_filter_code(a, 0)",
                        paVar4);
    iVar1 = archive_format(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'Ʋ',0x30004,"ARCHIVE_FORMAT_TAR_GNUTAR",(long)iVar1,"archive_format(a)",
                        paVar4);
    iVar1 = archive_read_close(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'Ƶ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
    iVar1 = archive_read_free(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'ƶ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  }
  extract_reference_file("test_read_format_gtar_filename_koi8r.tar.Z");
  pcVar3 = setlocale(6,"Russian_Russia.866");
  if ((pcVar3 == (char *)0x0) && (pcVar3 = setlocale(6,"ru_RU.CP866"), pcVar3 == (char *)0x0)) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                   ,L'Ä');
    test_skipping("ru_RU.CP866 locale not available on this system.");
  }
  else {
    paVar4 = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                     ,L'È',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_read_support_filter_all(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'É',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                        paVar4);
    iVar1 = archive_read_support_format_all(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'Ê',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                        paVar4);
    wVar2 = archive_read_set_options(paVar4,"hdrcharset=KOI8-R");
    if (wVar2 == L'\0') {
      wVar2 = archive_read_open_filename(paVar4,"test_read_format_gtar_filename_koi8r.tar.Z",0x2800)
      ;
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'Ñ',0,"ARCHIVE_OK",(long)wVar2,
                          "archive_read_open_filename(a, refname, 10240)",paVar4);
      iVar1 = archive_read_next_header(paVar4,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'Ô',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar4);
      pcVar3 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                 ,L'Ö',anon_var_dwarf_5a386,"\"\\xaf\\xe0\\xa8\\xa2\\xa5\\xe2\"",pcVar3,
                 "archive_entry_pathname(ae)",(void *)0x0,L'\0');
      iVar5 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'×',6,"6",iVar5,"archive_entry_size(ae)",(void *)0x0);
      iVar1 = archive_read_next_header(paVar4,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'Ú',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar4);
      pcVar3 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                 ,L'Ü',anon_var_dwarf_5a370,"\"\\x8f\\x90\\x88\\x82\\x85\\x92\"",pcVar3,
                 "archive_entry_pathname(ae)",(void *)0x0,L'\0');
      iVar5 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'Ý',6,"6",iVar5,"archive_entry_size(ae)",(void *)0x0);
      iVar1 = archive_read_next_header(paVar4,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'á',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar4);
      iVar1 = archive_filter_code(paVar4,0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'ä',3,"ARCHIVE_FILTER_COMPRESS",(long)iVar1,"archive_filter_code(a, 0)"
                          ,paVar4);
      iVar1 = archive_format(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'å',0x30004,"ARCHIVE_FORMAT_TAR_GNUTAR",(long)iVar1,"archive_format(a)"
                          ,paVar4);
      iVar1 = archive_read_close(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'è',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
    }
    else {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                     ,L'Ì');
      test_skipping("This system cannot convert character-set from KOI8-R to CP866.");
    }
    iVar1 = archive_read_free(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'ê',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  }
  pcVar3 = setlocale(6,"en_US.UTF-8");
  if (pcVar3 == (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                   ,L'÷');
    test_skipping("en_US.UTF-8 locale not available on this system.");
  }
  else {
    paVar4 = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                     ,L'û',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_read_support_filter_all(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'ü',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                        paVar4);
    iVar1 = archive_read_support_format_all(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'ý',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                        paVar4);
    wVar2 = archive_read_set_options(paVar4,"hdrcharset=KOI8-R");
    if (wVar2 == L'\0') {
      wVar2 = archive_read_open_filename(paVar4,"test_read_format_gtar_filename_koi8r.tar.Z",0x2800)
      ;
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'Ą',0,"ARCHIVE_OK",(long)wVar2,
                          "archive_read_open_filename(a, refname, 10240)",paVar4);
      iVar1 = archive_read_next_header(paVar4,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'ć',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar4);
      pcVar3 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                 ,L'ĉ',anon_var_dwarf_5a2b4,
                 "\"\\xd0\\xbf\\xd1\\x80\\xd0\\xb8\\xd0\\xb2\\xd0\\xb5\\xd1\\x82\"",pcVar3,
                 "archive_entry_pathname(ae)",(void *)0x0,L'\0');
      iVar5 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'Ċ',6,"6",iVar5,"archive_entry_size(ae)",(void *)0x0);
      iVar1 = archive_read_next_header(paVar4,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'č',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar4);
      pcVar3 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                 ,L'ď',anon_var_dwarf_5a292,
                 "\"\\xd0\\x9f\\xd0\\xa0\\xd0\\x98\\xd0\\x92\\xd0\\x95\\xd0\\xa2\"",pcVar3,
                 "archive_entry_pathname(ae)",(void *)0x0,L'\0');
      iVar5 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'Đ',6,"6",iVar5,"archive_entry_size(ae)",(void *)0x0);
      iVar1 = archive_read_next_header(paVar4,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'Ĕ',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar4);
      iVar1 = archive_filter_code(paVar4,0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'ė',3,"ARCHIVE_FILTER_COMPRESS",(long)iVar1,"archive_filter_code(a, 0)"
                          ,paVar4);
      iVar1 = archive_format(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'Ę',0x30004,"ARCHIVE_FORMAT_TAR_GNUTAR",(long)iVar1,"archive_format(a)"
                          ,paVar4);
      iVar1 = archive_read_close(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'ě',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
    }
    else {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                     ,L'ÿ');
      test_skipping("This system cannot convert character-set from KOI8-R to UTF-8.");
    }
    iVar1 = archive_read_free(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'ĝ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  }
  pcVar3 = setlocale(6,"Russian_Russia");
  if ((pcVar3 == (char *)0x0) && (pcVar3 = setlocale(6,"ru_RU.CP1251"), pcVar3 == (char *)0x0)) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                   ,L'Ǆ');
    test_skipping("CP1251 locale not available on this system.");
    return;
  }
  paVar4 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                   ,L'ǈ',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                      ,L'ǉ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar4)
  ;
  iVar1 = archive_read_support_format_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                      ,L'Ǌ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar4)
  ;
  wVar2 = archive_read_set_options(paVar4,"hdrcharset=KOI8-R");
  if (wVar2 == L'\0') {
    wVar2 = archive_read_open_filename(paVar4,"test_read_format_gtar_filename_koi8r.tar.Z",0x2800);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'Ǒ',0,"ARCHIVE_OK",(long)wVar2,
                        "archive_read_open_filename(a, refname, 10240)",paVar4);
    iVar1 = archive_read_next_header(paVar4,&local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'ǔ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4)
    ;
    pcVar3 = archive_entry_pathname(local_38);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
               ,L'ǖ',anon_var_dwarf_5a30c,"\"\\xef\\xf0\\xe8\\xe2\\xe5\\xf2\"",pcVar3,
               "archive_entry_pathname(ae)",(void *)0x0,L'\0');
    iVar5 = archive_entry_size(local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'Ǘ',6,"6",iVar5,"archive_entry_size(ae)",(void *)0x0);
    iVar1 = archive_read_next_header(paVar4,&local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'ǚ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4)
    ;
    pcVar3 = archive_entry_pathname(local_38);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
               ,L'ǜ',anon_var_dwarf_5a2f6,"\"\\xcf\\xd0\\xc8\\xc2\\xc5\\xd2\"",pcVar3,
               "archive_entry_pathname(ae)",(void *)0x0,L'\0');
    iVar5 = archive_entry_size(local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'ǝ',6,"6",iVar5,"archive_entry_size(ae)",(void *)0x0);
    iVar1 = archive_read_next_header(paVar4,&local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'ǡ',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4
                       );
    iVar1 = archive_filter_code(paVar4,0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'Ǥ',3,"ARCHIVE_FILTER_COMPRESS",(long)iVar1,"archive_filter_code(a, 0)",
                        paVar4);
    iVar1 = archive_format(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'ǥ',0x30004,"ARCHIVE_FORMAT_TAR_GNUTAR",(long)iVar1,"archive_format(a)",
                        paVar4);
    iVar1 = archive_read_close(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'Ǩ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
  }
  else {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                   ,L'ǌ');
    test_skipping("This system cannot convert character-set from KOI8-R to CP1251.");
  }
  iVar1 = archive_read_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                      ,L'Ǫ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_gtar_filename)
{
	const char *refname1 = "test_read_format_gtar_filename_eucjp.tar.Z";
	const char *refname2 = "test_read_format_gtar_filename_cp866.tar.Z";
	const char *refname3 = "test_read_format_gtar_filename_koi8r.tar.Z";

	extract_reference_file(refname1);
	test_read_format_gtar_filename_eucJP_UTF8(refname1);
	test_read_format_gtar_filename_eucJP_CP932(refname1);

	extract_reference_file(refname2);
	test_read_format_gtar_filename_CP866_KOI8R(refname2);
	test_read_format_gtar_filename_CP866_UTF8(refname2);
	test_read_format_gtar_filename_CP866_CP1251(refname2);
	test_read_format_gtar_filename_CP866_CP1251_win(refname2);

	extract_reference_file(refname3);
	test_read_format_gtar_filename_KOI8R_CP866(refname3);
	test_read_format_gtar_filename_KOI8R_UTF8(refname3);
	test_read_format_gtar_filename_KOI8R_CP1251(refname3);
}